

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall clipp::parsing_result::any_error(parsing_result *this)

{
  bool bVar1;
  size_type sVar2;
  missing_events *this_00;
  undefined1 local_11;
  parsing_result *this_local;
  
  sVar2 = unmapped_args_count(this);
  local_11 = true;
  if (sVar2 == 0) {
    this_00 = missing(this);
    bVar1 = std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>
            ::empty(this_00);
    local_11 = true;
    if (bVar1) {
      bVar1 = any_blocked(this);
      local_11 = true;
      if (!bVar1) {
        bVar1 = any_conflict(this);
        local_11 = true;
        if (!bVar1) {
          local_11 = any_bad_repeat(this);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool any_error() const noexcept {
        return unmapped_args_count() > 0 || !missing().empty() ||
               any_blocked() || any_conflict() || any_bad_repeat();
    }